

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

void __thiscall AWeapon::CallEndPowerup(AWeapon *this)

{
  PClass *pPVar1;
  PNativeStruct *pPVar2;
  int iVar3;
  DObject *p;
  PFunction *pPVar4;
  undefined4 extraout_var;
  VMFunction *func;
  undefined8 *in_FS_OFFSET;
  VMValue params [1];
  anon_union_16_5_cf148060_for_VMValue_0 local_28;
  
  if (CallEndPowerup::VIndex == 0xffffffff) {
    pPVar2 = &(RegistrationInfo.MyClass)->super_PNativeStruct;
    iVar3 = FName::NameManager::FindName(&FName::NameData,"EndPowerup",false);
    local_28.i = iVar3;
    p = (DObject *)
        PSymbolTable::FindSymbol
                  (&(pPVar2->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.Symbols
                   ,(FName *)&local_28.field_1,false);
    pPVar4 = dyn_cast<PFunction>(p);
    if (pPVar4 == (PFunction *)0x0) {
      __assert_fail("sym != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./virtual.h"
                    ,5,"unsigned int GetVirtualIndex(PClass *, const char *)");
    }
    CallEndPowerup::VIndex = ((pPVar4->Variants).Array)->Implementation->VirtualIndex;
    if (CallEndPowerup::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x33d,"void AWeapon::CallEndPowerup()");
    }
  }
  if ((this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.Class
      == (PClass *)0x0) {
    iVar3 = (**(this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
               super_DObject._vptr_DObject)(this);
    (this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var,iVar3);
  }
  pPVar1 = (this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
           Class;
  if (CallEndPowerup::VIndex < (pPVar1->Virtuals).Count) {
    func = (pPVar1->Virtuals).Array[CallEndPowerup::VIndex];
  }
  else {
    func = (VMFunction *)0x0;
  }
  if (func == (VMFunction *)0x0) {
    (*(this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
      _vptr_DObject[0x31])(this);
  }
  else {
    local_28.field_1.atag = 1;
    local_28.field_3.Type = '\x03';
    local_28.field_1.a = this;
    GlobalVMStack::__tls_init();
    VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,func,(VMValue *)&local_28.field_1,1,
                       (VMReturn *)0x0,0,(VMException **)0x0);
    if (local_28.field_3.Type == '\x02') {
      FString::~FString((FString *)&local_28.field_1);
    }
  }
  return;
}

Assistant:

void AWeapon::CallEndPowerup()
{
	IFVIRTUAL(AWeapon, EndPowerup)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[1] = { (DObject*)this };
		GlobalVMStack.Call(func, params, 1, nullptr, 0, nullptr);
	}
	else EndPowerup();
}